

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

voffset_t flatbuffers::FieldIndexToOffset(voffset_t field_id)

{
  if (field_id < 0x7ffe) {
    return field_id * 2 + 4;
  }
  __assert_fail("offset < std::numeric_limits<voffset_t>::max()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x31,"voffset_t flatbuffers::FieldIndexToOffset(voffset_t)");
}

Assistant:

inline voffset_t FieldIndexToOffset(voffset_t field_id) {
  // Should correspond to what EndTable() below builds up.
  const voffset_t fixed_fields =
      2 * sizeof(voffset_t);  // Vtable size and Object Size.
  size_t offset = fixed_fields + field_id * sizeof(voffset_t);
  FLATBUFFERS_ASSERT(offset < std::numeric_limits<voffset_t>::max());
  return static_cast<voffset_t>(offset);
}